

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharBuffer.hpp
# Opt level: O2

void __thiscall antlr::CharBuffer::~CharBuffer(CharBuffer *this)

{
  InputBuffer::~InputBuffer(&this->super_InputBuffer);
  operator_delete(this,0x40);
  return;
}

Assistant:

class ANTLR_API CharBuffer : public InputBuffer {
public:
	/// Create a character buffer
	CharBuffer( ANTLR_USE_NAMESPACE(std)istream& input );
	/// Get the next character from the stream
	int getChar();

protected:

private:
	// character source
	ANTLR_USE_NAMESPACE(std)istream& input;

	// NOTE: Unimplemented
	CharBuffer(const CharBuffer& other);
	CharBuffer& operator=(const CharBuffer& other);
}